

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_mean(ggml_context *ctx,ggml_tensor *a)

{
  uint uVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  int extraout_EDX;
  ggml_tensor *extraout_RDX;
  void *data;
  bool bVar5;
  int local_28;
  undefined8 local_24;
  int local_1c;
  
  if (a->grad == (ggml_tensor *)0x0) {
    local_28 = 1;
    local_24 = *(undefined8 *)(a->ne + 1);
    local_1c = a->ne[3];
    pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,a->n_dims,&local_28,(void *)0x0);
    pgVar2->op = GGML_OP_MEAN;
    pgVar2->grad = (ggml_tensor *)0x0;
    pgVar2->src0 = a;
    pgVar2->src1 = (ggml_tensor *)0x0;
    return pgVar2;
  }
  ggml_mean_cold_1();
  uVar1 = a->ne[0];
  pgVar2 = (ggml_tensor *)(ulong)uVar1;
  if ((((extraout_RDX->ne[0] % (int)uVar1 == 0) && (extraout_RDX->ne[1] % a->ne[1] == 0)) &&
      (extraout_RDX->ne[2] % a->ne[2] == 0)) && (extraout_RDX->ne[3] % a->ne[3] == 0)) {
    pgVar2 = a->grad;
    if (((uVar1 != extraout_RDX->ne[0]) || (a->ne[1] != extraout_RDX->ne[1])) ||
       ((a->ne[2] != extraout_RDX->ne[2] ||
        (a->ne[3] != extraout_RDX->ne[3] || pgVar2 != (ggml_tensor *)0x0)))) {
      pgVar4 = (ggml_tensor *)0x0;
      pgVar3 = ggml_new_tensor_impl(ctx,a->type,extraout_RDX->n_dims,extraout_RDX->ne,(void *)0x0);
      pgVar3->op = GGML_OP_REPEAT;
      if (pgVar2 != (ggml_tensor *)0x0) {
        pgVar4 = ggml_new_tensor_impl(ctx,pgVar3->type,pgVar3->n_dims,pgVar3->ne,(void *)0x0);
      }
      pgVar3->grad = pgVar4;
      pgVar3->src0 = a;
      pgVar3->src1 = extraout_RDX;
      a = pgVar3;
    }
    return a;
  }
  ggml_repeat_cold_1();
  if (extraout_EDX == 0) {
    bVar5 = pgVar2->grad != (ggml_tensor *)0x0;
  }
  else {
    bVar5 = false;
  }
  if ((char)extraout_EDX == '\0') {
    data = (void *)0x0;
  }
  else {
    data = pgVar2->data;
  }
  pgVar3 = ggml_new_tensor_impl(ctx,pgVar2->type,pgVar2->n_dims,pgVar2->ne,data);
  pgVar3->op = GGML_OP_ABS;
  if (bVar5) {
    pgVar4 = ggml_new_tensor_impl(ctx,pgVar3->type,pgVar3->n_dims,pgVar3->ne,(void *)0x0);
  }
  else {
    pgVar4 = (ggml_tensor *)0x0;
  }
  pgVar3->grad = pgVar4;
  pgVar3->src0 = pgVar2;
  pgVar3->src1 = (ggml_tensor *)0x0;
  return pgVar3;
}

Assistant:

struct ggml_tensor * ggml_mean(
        struct ggml_context * ctx,
        struct ggml_tensor * a) {
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement
        is_node = true;
    }

    int ne[GGML_MAX_DIMS] = { 1, a->ne[1], a->ne[2], a->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, a->n_dims, ne);

    result->op   = GGML_OP_MEAN;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}